

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

FunctionBody *
TTD::NSSnapValues::InflateTopLevelLoadedFunctionBodyInfo
          (TopLevelScriptLoadFunctionBodyResolveInfo *fbInfo,ScriptContext *ctx)

{
  uint uVar1;
  byte *script_00;
  DWORD_PTR sourceContext_00;
  LoadScriptFlag LVar2;
  SourceContextInfo *pSVar3;
  JavascriptFunction *this;
  ParseableFunctionInfo *pfi;
  FunctionBody *body;
  Utf8SourceInfo *this_00;
  ThreadContext *pTVar4;
  void *unaff_retaddr;
  undefined1 local_170 [7];
  bool isLibraryCode;
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  FunctionBody *globalBody;
  JavascriptFunction *scriptFunction;
  CompileScriptException se;
  Utf8SourceInfo *utf8SourceInfo;
  SRCINFO si;
  int chsize;
  SourceContextInfo *sourceContextInfo;
  uint32 srcUriLength;
  char16 *srcUri;
  uint64 sourceContext;
  uint32 scriptLength;
  byte *script;
  ScriptContext *ctx_local;
  TopLevelScriptLoadFunctionBodyResolveInfo *fbInfo_local;
  
  script_00 = (fbInfo->TopLevelBase).SourceBuffer;
  uVar1 = (fbInfo->TopLevelBase).ByteLength;
  sourceContext_00 = (fbInfo->TopLevelBase).SourceContextId;
  pSVar3 = Js::ScriptContext::GetSourceContextInfo
                     (ctx,sourceContext_00,(SimpleDataCacheWrapper *)0x0);
  if (pSVar3 != (SourceContextInfo *)0x0) {
    TTDAbort_unrecoverable_error
              (
              "On inflate we should either have clean ctxts or we want to optimize the inflate process by skipping redoing this work!!!"
              );
  }
  if ((bool)((fbInfo->TopLevelBase).IsUtf8 & 1U) ==
      ((fbInfo->LoadFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_Utf8Source)) {
    pSVar3 = Js::ScriptContext::CreateSourceContextInfo
                       (ctx,sourceContext_00,(fbInfo->TopLevelBase).SourceUri.Contents,
                        (ulong)(fbInfo->TopLevelBase).SourceUri.Length,(SimpleDataCacheWrapper *)0x0
                        ,(char16 *)0x0,0);
    si.grfsi = 2;
    if ((fbInfo->LoadFlag & LoadScriptFlag_Utf8Source) != LoadScriptFlag_None) {
      si.grfsi = 1;
    }
    SRCINFO::SRCINFO((SRCINFO *)&utf8SourceInfo,pSVar3,0,0,0,0,uVar1 / si.grfsi,0,
                     (fbInfo->TopLevelBase).ModuleId,0);
    se.bstrLine = (BSTR)0x0;
    CompileScriptException::CompileScriptException((CompileScriptException *)&scriptFunction);
    if ((fbInfo->TopLevelBase).DbgSerializedBytecodeSize == 0) {
      this = Js::ScriptContext::LoadScript
                       (ctx,script_00,(ulong)uVar1,(SRCINFO *)&utf8SourceInfo,
                        (CompileScriptException *)&scriptFunction,(Utf8SourceInfo **)&se.bstrLine,
                        L"Global code",fbInfo->LoadFlag,(Var)0x0);
      if (this != (JavascriptFunction *)0x0) {
        pfi = Js::JavascriptFunction::GetParseableFunctionInfo(this);
        body = JsSupport::ForceAndGetFunctionBody(pfi);
        __enterScriptObject.library = (JavascriptLibrary *)0x0;
        Js::EnterScriptObject::EnterScriptObject
                  ((EnterScriptObject *)local_170,ctx,
                   (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,
                   &stack0x00000000,true,false,false);
        Js::ScriptContext::OnScriptStart(ctx,false,true);
        Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_170);
        ScriptContextTTD::ProcessFunctionBodyOnLoad(ctx->TTDContextInfo,body,(FunctionBody *)0x0);
        ScriptContextTTD::RegisterLoadedScript
                  (ctx->TTDContextInfo,body,(fbInfo->TopLevelBase).TopLevelBodyCtr);
        this_00 = Js::FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)body);
        Js::Utf8SourceInfo::SetSourceInfoForDebugReplay_TTD
                  (this_00,(fbInfo->TopLevelBase).TopLevelBodyCtr);
        Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_170);
        LVar2 = fbInfo->LoadFlag;
        pTVar4 = Js::ScriptContext::GetThreadContext(ctx);
        if ((pTVar4->TTDExecutionInfo != (ExecutionInfoManager *)0x0) && (-1 < (char)LVar2)) {
          pTVar4 = Js::ScriptContext::GetThreadContext(ctx);
          ExecutionInfoManager::ProcessScriptLoad
                    (pTVar4->TTDExecutionInfo,ctx,(fbInfo->TopLevelBase).TopLevelBodyCtr,body,
                     (Utf8SourceInfo *)se.bstrLine,(CompileScriptException *)&scriptFunction);
        }
        CompileScriptException::~CompileScriptException((CompileScriptException *)&scriptFunction);
        return body;
      }
      TTDAbort_unrecoverable_error("Something went wrong");
    }
    TTDAbort_unrecoverable_error("Not implemented yet -- this branch should never be taken.");
  }
  TTDAbort_unrecoverable_error("Utf8 status is inconsistent!!!");
}

Assistant:

Js::FunctionBody* InflateTopLevelLoadedFunctionBodyInfo(const TopLevelScriptLoadFunctionBodyResolveInfo* fbInfo, Js::ScriptContext* ctx)
        {
            byte* script = fbInfo->TopLevelBase.SourceBuffer;
            uint32 scriptLength = fbInfo->TopLevelBase.ByteLength;
            uint64 sourceContext = fbInfo->TopLevelBase.SourceContextId;

            TTDAssert(ctx->GetSourceContextInfo((DWORD_PTR)sourceContext, nullptr) == nullptr, "On inflate we should either have clean ctxts or we want to optimize the inflate process by skipping redoing this work!!!");
            TTDAssert(fbInfo->TopLevelBase.IsUtf8 == ((fbInfo->LoadFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_Utf8Source), "Utf8 status is inconsistent!!!");

            const char16* srcUri = fbInfo->TopLevelBase.SourceUri.Contents;
            uint32 srcUriLength = fbInfo->TopLevelBase.SourceUri.Length;

            SourceContextInfo * sourceContextInfo = ctx->CreateSourceContextInfo((DWORD_PTR)sourceContext, srcUri, srcUriLength, nullptr);

            TTDAssert(fbInfo->TopLevelBase.IsUtf8 || sizeof(wchar) == sizeof(char16), "Non-utf8 code only allowed on windows!!!");
            const int chsize = (fbInfo->LoadFlag & LoadScriptFlag_Utf8Source) ? sizeof(char) : sizeof(char16);
            SRCINFO si = {
                /* sourceContextInfo   */ sourceContextInfo,
                /* dlnHost             */ 0,
                /* ulColumnHost        */ 0,
                /* lnMinHost           */ 0,
                /* ichMinHost          */ 0,
                /* ichLimHost          */ static_cast<ULONG>(scriptLength / chsize), // OK to truncate since this is used to limit sourceText in debugDocument/compilation errors.
                /* ulCharOffset        */ 0,
                /* mod                 */ fbInfo->TopLevelBase.ModuleId,
                /* grfsi               */ 0
            };

            Js::Utf8SourceInfo* utf8SourceInfo = nullptr;
            CompileScriptException se;
            Js::JavascriptFunction* scriptFunction = nullptr;
            Js::FunctionBody* globalBody = nullptr;

            if(fbInfo->TopLevelBase.DbgSerializedBytecodeSize != 0)
            {
                //
                //TODO: Bytecode serializer does not support debug bytecode (StatementMaps vs Positions) so add this to serializer code.
                //      Then we can add code do optimized bytecode reload here.
                //
                TTDAssert(false, "Not implemented yet -- this branch should never be taken.");
            }
            else
            {
                scriptFunction = ctx->LoadScript(script, scriptLength, &si, &se, &utf8SourceInfo, Js::Constants::GlobalCode, fbInfo->LoadFlag, nullptr);
                TTDAssert(scriptFunction != nullptr, "Something went wrong");

                globalBody = TTD::JsSupport::ForceAndGetFunctionBody(scriptFunction->GetParseableFunctionInfo());

                //
                //TODO: Bytecode serializer does not suppper debug bytecode (StatementMaps vs Positions) so add this to serializer code.
                //      Then we can add code to do optimized bytecode reload here.
                //
            }

            ////
            //We don't do this automatically in the load script helper so do it here
            BEGIN_JS_RUNTIME_CALL(ctx);
            {
                ctx->TTDContextInfo->ProcessFunctionBodyOnLoad(globalBody, nullptr);
                ctx->TTDContextInfo->RegisterLoadedScript(globalBody, fbInfo->TopLevelBase.TopLevelBodyCtr);

                globalBody->GetUtf8SourceInfo()->SetSourceInfoForDebugReplay_TTD(fbInfo->TopLevelBase.TopLevelBodyCtr);
            }
            END_JS_RUNTIME_CALL(ctx);

            bool isLibraryCode = ((fbInfo->LoadFlag & LoadScriptFlag_LibraryCode) == LoadScriptFlag_LibraryCode);
            if(ctx->GetThreadContext()->TTDExecutionInfo != nullptr && !isLibraryCode)
            {
                ctx->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad(ctx, fbInfo->TopLevelBase.TopLevelBodyCtr, globalBody, utf8SourceInfo, &se);
            }
            ////

            return globalBody;
        }